

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonBondedInteractionsSectionParser.cpp
# Opt level: O0

NonBondedInteractionTypeEnum __thiscall
OpenMD::NonBondedInteractionsSectionParser::getNonBondedInteractionTypeEnum
          (NonBondedInteractionsSectionParser *this,string *str)

{
  bool bVar1;
  pointer ppVar2;
  iterator i;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  NonBondedInteractionTypeEnum NVar3;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>
  local_18 [3];
  
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>
  ::_Rb_tree_iterator(local_18);
  local_20 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
                     *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                    (key_type *)0x221b45);
  local_18[0]._M_node = local_20;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
              *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  bVar1 = std::operator==(local_18,&local_28);
  if (bVar1) {
    NVar3 = Unknown;
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>
                           *)0x221b91);
    NVar3 = ppVar2->second;
  }
  return NVar3;
}

Assistant:

NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum
      NonBondedInteractionsSectionParser::getNonBondedInteractionTypeEnum(
          const std::string& str) {
    std::map<std::string, NonBondedInteractionTypeEnum>::iterator i;
    i = stringToEnumMap_.find(str);

    return i == stringToEnumMap_.end() ? Unknown : i->second;
  }